

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Buffers::ClearTest::LogError
          (ClearTest *this,bool use_sub_data,GLenum internalformat)

{
  ostringstream *this_00;
  string the_log;
  string asStack_1b8 [32];
  undefined1 local_198 [384];
  
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_1b8,"Unexpected error occurred during Test of ",(allocator<char> *)local_198);
  std::__cxx11::string::append((char *)asStack_1b8);
  local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,asStack_1b8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::__cxx11::string::~string(asStack_1b8);
  return;
}

Assistant:

void ClearTest::LogError(bool use_sub_data, glw::GLenum internalformat)
{
	(void)internalformat;
	std::string the_log = "Unexpected error occurred during Test of ";

	if (use_sub_data)
	{
		the_log.append("ClearNamedBufferSubData with internalformat ");
	}
	else
	{
		the_log.append("ClearNamedBufferData with internalformat ");
	}

	//the_log.append(glu::getPixelFormatName(internalformat));

	m_context.getTestContext().getLog() << tcu::TestLog::Message << the_log << tcu::TestLog::EndMessage;
}